

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

size_t ggml_nbytes(ggml_tensor *tensor)

{
  ggml_type *in_RDI;
  int i_2;
  int i_1;
  size_t blck_size;
  size_t nbytes;
  int i;
  int local_30;
  int local_2c;
  size_t local_20;
  int local_14;
  
  local_14 = 0;
  while( true ) {
    if (3 < local_14) {
      local_20 = ggml_blck_size(*in_RDI);
      if (local_20 == 1) {
        local_20 = ggml_type_size(*in_RDI);
        for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
          local_20 = (*(undefined8 *)(in_RDI + (long)local_2c * 2 + 4) - GGML_TYPE_F16) *
                     *(undefined8 *)(in_RDI + (long)local_2c * 2 + 0xc) + local_20;
        }
      }
      else {
        local_20 = (ulong)(*(undefined8 *)(in_RDI + 4) * *(undefined8 *)(in_RDI + 0xc)) / local_20;
        for (local_30 = 1; local_30 < 4; local_30 = local_30 + 1) {
          local_20 = (*(undefined8 *)(in_RDI + (long)local_30 * 2 + 4) - GGML_TYPE_F16) *
                     *(undefined8 *)(in_RDI + (long)local_30 * 2 + 0xc) + local_20;
        }
      }
      return local_20;
    }
    if ((long)*(undefined8 *)(in_RDI + (long)local_14 * 2 + 4) < 1) break;
    local_14 = local_14 + 1;
  }
  return 0;
}

Assistant:

size_t ggml_nbytes(const struct ggml_tensor * tensor) {
    for (int i = 0; i < GGML_MAX_DIMS; ++i) {
        if (tensor->ne[i] <= 0) {
            return 0;
        }
    }

    size_t nbytes;
    const size_t blck_size = ggml_blck_size(tensor->type);
    if (blck_size == 1) {
        nbytes = ggml_type_size(tensor->type);
        for (int i = 0; i < GGML_MAX_DIMS; ++i) {
            nbytes += (tensor->ne[i] - 1)*tensor->nb[i];
        }
    }
    else {
        nbytes = tensor->ne[0]*tensor->nb[0]/blck_size;
        for (int i = 1; i < GGML_MAX_DIMS; ++i) {
            nbytes += (tensor->ne[i] - 1)*tensor->nb[i];
        }
    }

    return nbytes;
}